

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

CAmount wallet::GenerateChangeTarget
                  (CAmount payment_value,CAmount change_fee,FastRandomContext *rng)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (25000 < payment_value) {
    uVar3 = payment_value * 2;
    if (999999 < uVar3) {
      uVar3 = 1000000;
    }
    lVar2 = RandomMixin<FastRandomContext>::randrange<long>
                      (&rng->super_RandomMixin<FastRandomContext>,uVar3 - 50000);
    change_fee = change_fee + lVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return change_fee + 50000;
  }
  __stack_chk_fail();
}

Assistant:

CAmount GenerateChangeTarget(const CAmount payment_value, const CAmount change_fee, FastRandomContext& rng)
{
    if (payment_value <= CHANGE_LOWER / 2) {
        return change_fee + CHANGE_LOWER;
    } else {
        // random value between 50ksat and min (payment_value * 2, 1milsat)
        const auto upper_bound = std::min(payment_value * 2, CHANGE_UPPER);
        return change_fee + rng.randrange(upper_bound - CHANGE_LOWER) + CHANGE_LOWER;
    }
}